

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

bool __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethod
          (ConversionStream *this,iterator *Token,iterator *ScopeStart,iterator *ScopeEnd)

{
  _List_node_base *p_Var1;
  HLSL2GLSLConverterImpl *this_00;
  _Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
  _Var2;
  ConversionStream *this_01;
  bool bVar3;
  uint uVar4;
  Uint32 _NumArgs;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> __position;
  const_iterator cVar5;
  const_iterator cVar6;
  iterator iVar7;
  iterator *Args_1;
  TokenListType *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_7;
  allocator local_1e1;
  _Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
  local_1e0;
  HLSLObjectInfo *local_1d8;
  iterator *local_1d0;
  Uint32 NumArguments;
  const_iterator local_1c0;
  ConversionStream *local_1b8;
  string msg;
  String local_160;
  const_iterator local_140;
  iterator ArgsListEndToken;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __position._M_node = Token->_M_node;
  Args_1 = ScopeEnd;
  local_1d0 = Token;
  if ((ScopeEnd->_M_node == __position._M_node) ||
     (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__position._M_node[1]._M_prev,"."), !bVar3)) {
    FormatString<char[26],char[46]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"DotToken != ScopeEnd && Token->Literal == \".\"",
               (char (*) [46])Args_1);
    Args_1 = (iterator *)0x6b6;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessObjectMethod",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6b6);
    std::__cxx11::string::~string((string *)&msg);
  }
  p_Var1 = (__position._M_node)->_M_next;
  if ((p_Var1 == ScopeEnd->_M_node) || (*(int *)&p_Var1[1]._M_next != 0x13b)) {
    FormatString<char[26],char[70]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "MethodToken != ScopeEnd && MethodToken->Type == TokenType::Identifier",
               (char (*) [70])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ProcessObjectMethod",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6b9);
    std::__cxx11::string::~string((string *)&msg);
  }
  local_1e0._M_cur = (__node_type *)p_Var1;
  local_1b8 = this;
  local_140._M_node = __position._M_node;
  while ((this_01 = local_1b8, cVar5._M_node = __position._M_node,
         __position._M_node != ScopeStart->_M_node &&
         (cVar5._M_node = ScopeStart->_M_node, *(int *)&__position._M_node[1]._M_next != 0x13b))) {
    __position._M_node = (__position._M_node)->_M_prev;
    uVar4 = *(int *)&__position._M_node[1]._M_next - 0x136;
    if ((uVar4 < 5) &&
       (((0x15U >> (uVar4 & 0x1f) & 1) != 0 &&
        (__position = Parsing::
                      FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                                (ScopeStart,ScopeEnd,__position),
        local_1d0->_M_node == ScopeEnd->_M_node)))) {
      FormatString<char[45]>(&msg,(char (*) [45])"Unable to find matching open square bracket.");
      PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                (&local_160,local_1b8,local_1d0,4);
      LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                (false,"ProcessObjectMethod",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x6ca,&msg,(char (*) [2])0x2c8293,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  if (__position._M_node != cVar5._M_node) {
    local_1d8 = FindHLSLObject(local_1b8,(String *)&__position._M_node[1]._M_prev);
    if ((((local_1d8 != (HLSLObjectInfo *)0x0) &&
         (local_1c0._M_node = *(_List_node_base **)&(local_1e0._M_cur)->super__Hash_node_base,
         local_1c0._M_node != ScopeEnd->_M_node)) &&
        (*(int *)&local_1c0._M_node[1]._M_next == 0x135)) &&
       (ArgsListEndToken._M_node = local_1c0._M_node,
       _NumArgs = CountFunctionArguments(this_01,&ArgsListEndToken,ScopeEnd),
       ArgsListEndToken._M_node != ScopeEnd->_M_node)) {
      this_00 = this_01->m_Converter;
      NumArguments = _NumArgs;
      std::__cxx11::string::string
                ((string *)&local_160,
                 (char *)((_List_node_base *)((long)local_1e0._M_cur + 0x10))->_M_prev,&local_1e1);
      FunctionStubHashKey::FunctionStubHashKey
                ((FunctionStubHashKey *)&msg,&local_1d8->GLSLType,&local_160,_NumArgs);
      cVar5._M_node = local_1c0._M_node;
      cVar6 = std::
              _Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<Diligent::FunctionStubHashKey,_std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_std::allocator<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::FunctionStubHashKey>,_Diligent::FunctionStubHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this_00,(key_type *)&msg);
      FunctionStubHashKey::~FunctionStubHashKey((FunctionStubHashKey *)&msg);
      Args_7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c37fc;
      std::__cxx11::string::~string((string *)&local_160);
      if (cVar6.
          super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
          ._M_cur != (__node_type *)0x0) {
        std::__cxx11::string::string((string *)&local_70,",",(allocator *)&local_160);
        local_1e0 = cVar6.
                    super__Node_iterator_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                    ._M_cur;
        std::__cxx11::string::string((string *)&local_50,"",&local_1e1);
        Parsing::HLSLTokenInfo::HLSLTokenInfo
                  ((HLSLTokenInfo *)&msg,Comma,&local_70,&local_50,0xffffffffffffffff);
        Parsing::HLSLTokenInfo::operator=
                  ((HLSLTokenInfo *)(cVar5._M_node + 1),(HLSLTokenInfo *)&msg);
        Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
        cVar5._M_node = local_1c0._M_node;
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        this_02 = &this_01->m_Tokens;
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        erase(this_02,local_140,cVar5);
        _Var2._M_cur = local_1e0._M_cur;
        std::__cxx11::string::string
                  ((string *)&local_90,
                   *(char **)((long)&((local_1e0._M_cur)->
                                     super__Hash_node_value<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>
                                     ._M_storage._M_storage + 0x28),(allocator *)&local_160);
        std::__cxx11::string::string
                  ((string *)&local_b0,(char *)__position._M_node[3]._M_prev,&local_1e1);
        Parsing::HLSLTokenInfo::HLSLTokenInfo
                  ((HLSLTokenInfo *)&msg,Identifier,&local_90,&local_b0,0xffffffffffffffff);
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        emplace<Diligent::Parsing::HLSLTokenInfo>
                  (this_02,(const_iterator)__position._M_node,(HLSLTokenInfo *)&msg);
        Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::assign((char *)&__position._M_node[3]._M_prev);
        std::__cxx11::string::string((string *)&local_d0,"(",(allocator *)&local_160);
        std::__cxx11::string::string((string *)&local_f0,"",&local_1e1);
        Parsing::HLSLTokenInfo::HLSLTokenInfo
                  ((HLSLTokenInfo *)&msg,OpenParen,&local_d0,&local_f0,0xffffffffffffffff);
        std::__cxx11::
        list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
        emplace<Diligent::Parsing::HLSLTokenInfo>
                  (this_02,(const_iterator)__position._M_node,(HLSLTokenInfo *)&msg);
        Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_d0);
        iVar7 = ArgsListEndToken;
        local_1d0->_M_node = cVar5._M_node;
        if (*(long *)((long)&((_Var2._M_cur)->
                             super__Hash_node_value<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>
                             ._M_storage._M_storage + 0x50) == 0) {
          return true;
        }
        std::__cxx11::string::string
                  ((string *)&local_110,
                   *(char **)((long)&((_Var2._M_cur)->
                                     super__Hash_node_value<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<const_Diligent::FunctionStubHashKey,_Diligent::HLSL2GLSLConverterImpl::GLSLStubInfo>_>
                                     ._M_storage._M_storage + 0x48),(allocator *)&local_160);
        std::__cxx11::string::string((string *)&local_130,"",&local_1e1);
        Parsing::HLSLTokenInfo::HLSLTokenInfo
                  ((HLSLTokenInfo *)&msg,TextBlock,&local_110,&local_130,0xffffffffffffffff);
        iVar7 = std::__cxx11::
                list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                ::emplace<Diligent::Parsing::HLSLTokenInfo>
                          (this_02,iVar7._M_node,(HLSLTokenInfo *)&msg);
        Parsing::HLSLTokenInfo::~HLSLTokenInfo((HLSLTokenInfo *)&msg);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::push_back((char)iVar7._M_node + '\x18');
        return true;
      }
      FormatString<char[34],std::__cxx11::string,char[2],std::__cxx11::string,char[2],unsigned_int,char[27],std::__cxx11::string>
                (&msg,(Diligent *)"Unable to find function stub for ",
                 (char (*) [34])&__position._M_node[1]._M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2eb1f2,
                 (char (*) [2])&((_List_node_base *)((long)local_1e0._M_cur + 0x10))->_M_prev,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2b52ea,
                 (char (*) [2])&NumArguments,(uint *)" args). GLSL object type: ",
                 (char (*) [27])local_1d8,Args_7);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return false;
}

Assistant:

bool HLSL2GLSLConverterImpl::ConversionStream::ProcessObjectMethod(TokenListType::iterator&       Token,
                                                                   const TokenListType::iterator& ScopeStart,
                                                                   const TokenListType::iterator& ScopeEnd)
{
    // TestText.Sample( ...
    //         ^
    //      DotToken
    auto DotToken = Token;
    VERIFY_EXPR(DotToken != ScopeEnd && Token->Literal == ".");
    auto MethodToken = DotToken;
    ++MethodToken;
    VERIFY_EXPR(MethodToken != ScopeEnd && MethodToken->Type == TokenType::Identifier);
    // TestText.Sample( ...
    //          ^
    //     MethodToken
    auto IdentifierToken = DotToken;
    // m_Tokens contains dummy node at the beginning, so we can
    // check for ScopeStart to break the loop
    while (IdentifierToken != ScopeStart && IdentifierToken->Type != TokenType::Identifier)
    {
        --IdentifierToken;
        if (IdentifierToken->Type == TokenType::ClosingAngleBracket ||
            IdentifierToken->Type == TokenType::ClosingSquareBracket ||
            IdentifierToken->Type == TokenType::ClosingParen)
        {
            // TestText[idx[0]].Sample( ...
            //                ^
            IdentifierToken = Parsing::FindMatchingBracket(ScopeStart, ScopeEnd, IdentifierToken);
            VERIFY_PARSER_STATE(Token, Token != ScopeEnd, "Unable to find matching open square bracket.");
            // TestText[idx[0]].Sample( ...
            //         ^
        }
    }
    if (IdentifierToken == ScopeStart)
        return false;
    // TestTextArr[2].Sample( ...
    // ^
    // IdentifierToken

    // Try to find identifier
    const auto* pObjectInfo = FindHLSLObject(IdentifierToken->Literal);
    if (pObjectInfo == nullptr)
    {
        return false;
    }
    const auto& ObjectType = pObjectInfo->GLSLType;

    auto ArgsListStartToken = MethodToken;
    ++ArgsListStartToken;

    // TestText.Sample( ...
    //                ^
    //     ArgsListStartToken

    if (ArgsListStartToken == ScopeEnd || ArgsListStartToken->Type != TokenType::OpenParen)
        return false;
    auto   ArgsListEndToken = ArgsListStartToken;
    Uint32 NumArguments     = CountFunctionArguments(ArgsListEndToken, ScopeEnd);

    if (ArgsListEndToken == ScopeEnd)
        return false;
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                       ^
    //                                               ArgsListEndToken
    auto StubIt = m_Converter.m_GLSLStubs.find(FunctionStubHashKey(ObjectType, MethodToken->Literal.c_str(), NumArguments));
    if (StubIt == m_Converter.m_GLSLStubs.end())
    {
        LOG_ERROR_MESSAGE("Unable to find function stub for ", IdentifierToken->Literal, ".", MethodToken->Literal, "(", NumArguments, " args). GLSL object type: ", ObjectType);
        return false;
    }

    //            DotToken
    //               V
    // TestTextArr[2].Sample( TestTextArr_sampler, ...
    // ^                    ^
    // IdentifierToken      ArgsListStartToken

    *ArgsListStartToken = TokenInfo(TokenType::Comma, ",");
    // TestTextArr[2].Sample, TestTextArr_sampler, ...
    //               ^      ^
    //           DotToken  ArgsListStartToken

    m_Tokens.erase(DotToken, ArgsListStartToken);
    // TestTextArr[2], TestTextArr_sampler, ...
    // ^
    // IdentifierToken

    m_Tokens.insert(IdentifierToken, TokenInfo(TokenType::Identifier, StubIt->second.Name.c_str(), IdentifierToken->Delimiter.c_str()));
    IdentifierToken->Delimiter = " ";
    // FunctionStub TestTextArr[2], TestTextArr_sampler, ...
    //              ^
    //              IdentifierToken


    m_Tokens.insert(IdentifierToken, TokenInfo(TokenType::OpenParen, "("));
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...
    //               ^
    //               IdentifierToken

    Token = ArgsListStartToken;
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...
    //                             ^
    //                           Token

    // Nested function calls will be automatically processed:
    // FunctionStub( TestTextArr[2], TestTextArr_sampler, TestTex.Sample(...
    //                             ^
    //                           Token


    // Add swizzling if there is any
    if (StubIt->second.Swizzle.length() > 0)
    {
        // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...    );
        //                                                            ^
        //                                                     ArgsListEndToken

        auto SwizzleToken = m_Tokens.insert(ArgsListEndToken, TokenInfo(TokenType::TextBlock, StubIt->second.Swizzle.c_str(), ""));
        SwizzleToken->Literal.push_back(static_cast<Char>('0' + pObjectInfo->NumComponents));
        // FunctionStub( TestTextArr[2], TestTextArr_sampler, ...    )_SWIZZLE4;
        //                                                                     ^
        //                                                            ArgsListEndToken
    }
    return true;
}